

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O1

REF_STATUS ref_smooth_tri_pliant_uv(REF_GRID ref_grid,REF_INT node,REF_DBL *ideal_uv)

{
  double dVar1;
  REF_NODE pRVar2;
  REF_GEOM ref_geom;
  REF_DBL *uv;
  uint uVar3;
  double *pdVar4;
  long lVar5;
  double dVar6;
  REF_INT id;
  REF_INT nnode;
  REF_DBL total_force [3];
  REF_DBL n [3];
  REF_DBL dxyz [3];
  REF_DBL s [3];
  REF_DBL r [3];
  REF_DBL dxyz_duv [15];
  REF_DBL xyz_orig [3];
  REF_DBL duvn_dxyz [9];
  REF_DBL dxyz_duvn [9];
  REF_INT node_list [100];
  REF_INT local_3c0;
  int local_3bc;
  REF_DBL *local_3b8;
  REF_NODE local_3b0;
  REF_DBL local_3a8 [4];
  REF_DBL local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  double adStack_368 [4];
  REF_DBL local_348 [4];
  REF_DBL local_328 [4];
  REF_DBL local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  REF_DBL local_288 [4];
  REF_DBL local_268;
  double local_260 [9];
  REF_DBL local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  REF_DBL local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  REF_INT local_1c8 [102];
  
  pRVar2 = ref_grid->node;
  ref_geom = ref_grid->geom;
  uVar3 = ref_geom_unique_id(ref_geom,node,2,&local_3c0);
  if (uVar3 == 0) {
    local_3b0 = pRVar2;
    uVar3 = ref_geom_tuv(ref_geom,node,2,local_3c0,ideal_uv);
    if (uVar3 == 0) {
      uVar3 = ref_cell_node_list_around(ref_grid->cell[3],node,100,&local_3bc,local_1c8);
      if (uVar3 == 0) {
        local_3a8[0] = 0.0;
        local_3a8[1] = 0.0;
        local_3a8[2] = 0.0;
        local_3b8 = ideal_uv;
        if (0 < local_3bc) {
          lVar5 = 0;
          do {
            uVar3 = ref_smooth_add_pliant_force(local_3b0,node,local_1c8[lVar5],local_3a8);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x253,"ref_smooth_tri_pliant_uv",(ulong)uVar3,"edge");
              return uVar3;
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < local_3bc);
        }
        uv = local_3b8;
        dVar1 = ref_grid->adapt->smooth_pliant_alpha;
        lVar5 = 0;
        do {
          adStack_368[lVar5] = local_3a8[lVar5] * dVar1;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 3);
        uVar3 = ref_egads_eval_at(ref_geom,2,local_3c0,local_3b8,local_288,&local_308);
        if (uVar3 == 0) {
          uVar3 = ref_geom_face_rsn(ref_geom,local_3c0,uv,local_328,local_348,&local_388);
          if (uVar3 == 0) {
            local_208 = local_2f8;
            local_218 = local_308;
            uStack_210 = uStack_300;
            local_200 = local_2f0;
            uStack_1f8 = uStack_2e8;
            local_1f0 = local_2e0;
            local_1e8 = local_388;
            uStack_1e0 = uStack_380;
            local_1d8 = local_378;
            uVar3 = ref_matrix_inv_gen(3,&local_218,&local_268);
            if (uVar3 == 0) {
              dVar1 = *uv;
              dVar6 = uv[1];
              pdVar4 = local_260;
              lVar5 = 0;
              do {
                dVar1 = dVar1 + pdVar4[-1] * adStack_368[lVar5];
                dVar6 = dVar6 + adStack_368[lVar5] * *pdVar4;
                lVar5 = lVar5 + 1;
                pdVar4 = pdVar4 + 3;
              } while (lVar5 != 3);
              *uv = dVar1;
              uv[1] = dVar6;
              uVar3 = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x266,"ref_smooth_tri_pliant_uv",(ulong)uVar3,"inverse transformation");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                   ,0x25e,"ref_smooth_tri_pliant_uv",(ulong)uVar3,"eval orthonormal face system");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x25c,"ref_smooth_tri_pliant_uv",(ulong)uVar3,"eval face derivatives");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x24d,"ref_smooth_tri_pliant_uv",(ulong)uVar3,"node list for edges");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x249,"ref_smooth_tri_pliant_uv",(ulong)uVar3,"get uv_orig");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0x248,
           "ref_smooth_tri_pliant_uv",(ulong)uVar3,"get id");
  }
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_tri_pliant_uv(REF_GRID ref_grid,
                                                   REF_INT node,
                                                   REF_DBL *ideal_uv) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT ixyz, id;
  REF_INT max_node = 100, nnode;
  REF_INT node_list[100];
  REF_INT edge;
  REF_DBL total_force[3], dxyz[3], xyz_orig[3], dxyz_duv[15];
  REF_DBL dxyz_duvn[9], duvn_dxyz[9], r[3], s[3], n[3];
  REF_BOOL self_check = REF_FALSE;

  RSS(ref_geom_unique_id(ref_geom, node, REF_GEOM_FACE, &id), "get id");
  RSS(ref_geom_tuv(ref_geom, node, REF_GEOM_FACE, id, ideal_uv), "get uv_orig");

  RSS(ref_cell_node_list_around(ref_grid_tri(ref_grid), node, max_node, &nnode,
                                node_list),
      "node list for edges");

  for (ixyz = 0; ixyz < 3; ixyz++) total_force[ixyz] = 0.0;
  for (edge = 0; edge < nnode; edge++) {
    RSS(ref_smooth_add_pliant_force(ref_node, node, node_list[edge],
                                    total_force),
        "edge");
  }

  for (ixyz = 0; ixyz < 3; ixyz++)
    dxyz[ixyz] =
        ref_grid_adapt(ref_grid, smooth_pliant_alpha) * total_force[ixyz];

  RSS(ref_egads_eval_at(ref_geom, REF_GEOM_FACE, id, ideal_uv, xyz_orig,
                        dxyz_duv),
      "eval face derivatives");
  RSS(ref_geom_face_rsn(ref_geom, id, ideal_uv, r, s, n),
      "eval orthonormal face system");

  for (ixyz = 0; ixyz < 3; ixyz++) {
    dxyz_duvn[ixyz + 0] = dxyz_duv[ixyz + 0];
    dxyz_duvn[ixyz + 3] = dxyz_duv[ixyz + 3];
    dxyz_duvn[ixyz + 6] = n[ixyz];
  }

  RSS(ref_matrix_inv_gen(3, dxyz_duvn, duvn_dxyz), "inverse transformation");

  for (ixyz = 0; ixyz < 3; ixyz++) {
    ideal_uv[0] += duvn_dxyz[0 + 3 * ixyz] * dxyz[ixyz];
    ideal_uv[1] += duvn_dxyz[1 + 3 * ixyz] * dxyz[ixyz];
  }

  if (self_check) {
    REF_DBL du, dv, dn, check_dxyz[3];
    du = 0;
    dv = 0;
    dn = 0;
    for (ixyz = 0; ixyz < 3; ixyz++) {
      du += duvn_dxyz[0 + 3 * ixyz] * dxyz[ixyz];
      dv += duvn_dxyz[1 + 3 * ixyz] * dxyz[ixyz];
      dn += duvn_dxyz[2 + 3 * ixyz] * dxyz[ixyz];
    }
    check_dxyz[0] = du * dxyz_duv[0] + dv * dxyz_duv[3] + dn * n[0];
    check_dxyz[1] = du * dxyz_duv[1] + dv * dxyz_duv[4] + dn * n[1];
    check_dxyz[2] = du * dxyz_duv[2] + dv * dxyz_duv[5] + dn * n[2];
    if (ABS(check_dxyz[0] - dxyz[0]) > 1.0e-12 ||
        ABS(check_dxyz[1] - dxyz[1]) > 1.0e-12 ||
        ABS(check_dxyz[2] - dxyz[2]) > 1.0e-12) {
      printf("du %f dv %f dn %f dxyz %f %f %f\n", du, dv, dn, dxyz[0], dxyz[1],
             dxyz[2]);
      printf(" err %e %e %e\n", check_dxyz[0] - dxyz[0],
             check_dxyz[1] - dxyz[1], check_dxyz[2] - dxyz[2]);
      ref_node_location(ref_node, node);
    }
  }

  return REF_SUCCESS;
}